

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_write_locking.c
# Opt level: O1

int spawn_processes(int use_locking)

{
  __pid_t _Var1;
  int iVar2;
  long lVar3;
  int status;
  pid_t pids [8];
  uint local_3c;
  __pid_t local_38 [8];
  
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  lVar3 = 0;
  do {
    _Var1 = fork();
    if (_Var1 == 0) {
      process_func(use_locking);
      iVar2 = process_func(use_locking);
      exit(iVar2);
    }
    local_38[lVar3] = _Var1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  iVar2 = 0;
  do {
    waitpid(local_38[lVar3],(int *)&local_3c,0);
    local_3c = local_3c >> 8 & 0xff;
    iVar2 = (iVar2 + 1) - (uint)(local_3c == 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return iVar2;
}

Assistant:

int spawn_processes(int use_locking)
{
  int rc;
  int i;
  pid_t pids[PROCESSES] = {0};
  int status;
  pid_t child_pid;
  int failures = 0;

  /* Wait for the threads to finish */
  for (i = 0; i < PROCESSES; i++) {
    child_pid = fork();
    if (child_pid == 0) {
      /* We're a child. */
      process_func(use_locking);

      /* Try to write our kvtree and pass our return code to exit() */
      rc = process_func(use_locking);
      exit(rc);
      break;
    } else {
      pids[i] = child_pid;
      /* We're the original process (parent).  Keep spawning children */
    }
  }

  for (i = 0; i < PROCESSES; i++) {
    waitpid(pids[i], &status, 0);
    status = WEXITSTATUS(status);
    if (status != 0) {
      failures++;
    }
  }
  return failures;
}